

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_grid.hpp
# Opt level: O1

ostream * multidim::_impl_multi_grid::operator<<(ostream *os,Grid<float,_4UL,_2UL,_3UL> *rhs)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ostream_iterator<float,_char,_std::char_traits<char>_> *__value;
  size_t idx;
  ArrayCoord coord;
  ostream_iterator<float,_char,_std::char_traits<char>_> local_58;
  ulong local_48;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Values : [ ",0xb);
  local_58._M_string = " ";
  uVar5 = 0x19;
  local_58._M_stream = os;
  do {
    std::ostream_iterator<float,_char,_std::char_traits<char>_>::operator=(&local_58,(float *)rhs);
    rhs = (Grid<float,_4UL,_2UL,_3UL> *)((long)rhs + 4);
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,"]\nMapping index to coord :\n",0x1b);
  uVar5 = 0;
  do {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":{",2);
    local_58._M_stream = (ostream *)0x0;
    local_58._M_string = (char *)0x0;
    uVar3 = 0x18;
    lVar4 = 0;
    local_48 = uVar5;
    do {
      uVar3 = uVar3 / *(ulong *)((long)&DAT_00102098 + lVar4);
      uVar2 = local_48 / uVar3;
      local_48 = local_48 % uVar3;
      *(ulong *)((long)&local_58._M_stream + lVar4) = uVar2;
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
    local_40._M_string = ",";
    uVar3 = 4;
    __value = &local_58;
    local_40._M_stream = os;
    do {
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                (&local_40,(unsigned_long *)__value);
      __value = (ostream_iterator<float,_char,_std::char_traits<char>_> *)((long)__value + 8);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"}:",2);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    local_40._M_stream = (ostream_type *)CONCAT71(local_40._M_stream._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x18);
  return os;
}

Assistant:

auto& operator<<(std::ostream &os, const Grid& rhs) 
    {
        os << "Values : [ ";
        std::copy(rhs.values_.begin(), rhs.values_.end(), 
            std::ostream_iterator<typename Grid::value_type>(os, " "));

        os << "]\nMapping index to coord :\n";
        for(size_t idx = 0; idx < rhs.prod_dims; idx ++) {
            os << idx << ":{";
            auto coord = rhs.unflatten(idx);
            std::copy(coord.begin(), coord.end(), 
                std::ostream_iterator<typename ArrayCoord::value_type>(os, ","));
            os << "}:" << rhs.flatten(coord) << ' ';
        }

        return os;
    }